

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tadsrsc.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  FILE *pFVar4;
  size_t sVar5;
  ushort **ppuVar6;
  opdef *poVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint local_20f4;
  FILE *local_20f0;
  opctxdef opctx;
  char buf [128];
  char inbuf [4097];
  char tmpfile [4097];
  
  puts("TADS Resource Manager version 2.2.4");
  printf("Copyright (c) 1992, 1999 by Michael J. Roberts.  ");
  puts("All Rights Reserved.");
  if (argc < 2) {
    puts(
        "usage: tadsrsc [fileoptions] <resfile> [operations]\n   or: tadsrsc [fileoptions] <resfile> @<opfile> - read ops from <opfile>\nIf no operations are given, <resfile>\'s contents are listed.\nFile options:\n  -create      - create a new resource file\nOperations:\n  -type <type> - use <type> as the type for following resources\n  -replace     - add or replace resources that follow\n  -delete      - remove following resources from resfile\n  -add         - add following resources, but do not replace if present\n  <file>       - add/delete/replace resource, using filename as resource name\n  <dir>        - add/delete/replace all files in directory\n  <file>=<res> - add/delete/replace resource, using <res> as resource name\n-replace is assumed if no conflicting option is specified\nIf no -type option is specified, types are inferred from filename suffix:\n.bin, .com, and no \'.\' are assumed to be XFCN, all others HTML.\nValid resource types:\n  XFCN  - external function (executable code)\n  HTML  - graphic/sound resource for HTML TADS (JPEG, etc)"
        );
    os_term(1);
  }
  opctx.restype = 0;
  opctx.flag = 3;
  opctx.doing_type = 0;
  uVar11 = 1;
  if (1 < argc) {
    uVar11 = argc;
  }
  local_20f4 = 0;
  for (uVar12 = 1; (long)uVar12 < (long)argc; uVar12 = uVar12 + 1) {
    if (*argv[uVar12] != '-') goto LAB_0010547b;
    iVar3 = stricmp(argv[uVar12],"-create");
    uVar8 = 1;
    if (iVar3 != 0) {
      pcVar10 = argv[uVar12];
      printf("unrecognized file option \"%s\"");
      errexit("",(long)pcVar10);
      uVar8 = local_20f4;
    }
    local_20f4 = uVar8;
  }
  uVar12 = (ulong)uVar11;
LAB_0010547b:
  uVar13 = uVar12 & 0xffffffff;
  uVar11 = (int)uVar12 + 1;
  strcpy(inbuf,argv[uVar13]);
  os_defext(inbuf,"gam");
  if (local_20f4 == 0) {
    pcVar10 = "rb";
    __stream = fopen(inbuf,"rb");
    bVar2 = __stream != (FILE *)0x0;
    if (__stream == (FILE *)0x0) {
      errexit("unable to open resource file",(long)pcVar10);
    }
    else if (uVar11 == argc) {
      rscproc((osfildef *)__stream,(osfildef *)0x0,(opdef *)0x0);
      fclose(__stream);
      os_term(0);
    }
    strcpy(tmpfile,inbuf);
    sVar5 = strlen(tmpfile);
    pcVar10 = tmpfile + sVar5;
    do {
      pcVar9 = pcVar10;
      if (pcVar9 <= tmpfile) break;
      pcVar10 = pcVar9 + -1;
    } while ((0x2d < (byte)pcVar9[-1] - 0x2f) ||
            ((0x200000000801U >> ((ulong)((byte)pcVar9[-1] - 0x2f) & 0x3f) & 1) == 0));
    builtin_strncpy(pcVar9,"$TADSRSC.TMP",0xd);
    pcVar10 = "wb";
    local_20f0 = fopen(tmpfile,"wb");
    if (local_20f0 == (FILE *)0x0) {
      errexit("unable to create temporary file",(long)pcVar10);
      local_20f0 = (FILE *)0x0;
    }
  }
  else {
    pcVar10 = "wb";
    local_20f0 = fopen(inbuf,"wb");
    if (local_20f0 == (FILE *)0x0) {
      errexit("unable to create file",(long)pcVar10);
    }
    puts("\nFile created.");
    __stream = (FILE *)0x0;
    bVar2 = false;
  }
  if (((int)uVar11 < argc) && (*argv[uVar11] == '@')) {
    pcVar10 = "r";
    pFVar4 = fopen(argv[uVar11] + 1,"r");
    if (pFVar4 == (FILE *)0x0) {
      errexit("unable to open response file",(long)pcVar10);
    }
    poVar7 = (opdef *)0x0;
LAB_00105636:
    pcVar10 = fgets(buf,0x80,pFVar4);
    if (pcVar10 != (char *)0x0) {
      sVar5 = strlen(buf);
      pcVar10 = buf;
      if (((int)sVar5 != 0) && (iVar3 = (int)sVar5 + -1, buf[iVar3] == '\n')) {
        buf[iVar3] = '\0';
      }
      while( true ) {
        cVar1 = *pcVar10;
        if ((long)cVar1 < 0) break;
        ppuVar6 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
          if (cVar1 == '\0') goto LAB_00105636;
          break;
        }
        pcVar10 = pcVar10 + 1;
      }
      poVar7 = addop(poVar7,pcVar10,&opctx);
      goto LAB_00105636;
    }
    fclose(pFVar4);
  }
  else {
    poVar7 = (opdef *)0x0;
    for (; (int)uVar13 + 1 < argc; uVar13 = uVar13 + 1) {
      poVar7 = addop(poVar7,argv[uVar13 + 1],&opctx);
    }
  }
  pFVar4 = local_20f0;
  for (poVar7 = rscproc((osfildef *)__stream,(osfildef *)local_20f0,poVar7); poVar7 != (opdef *)0x0;
      poVar7 = poVar7->opnxt) {
    if ((poVar7->opflag & 4) == 0) {
      pFVar4 = (FILE *)poVar7->opres;
      printf("warning: resource \"%s\" not found\n");
    }
  }
  if (bVar2) {
    fclose(__stream);
  }
  if (local_20f0 != (FILE *)0x0) {
    fclose(local_20f0);
  }
  if (local_20f4 == 0) {
    iVar3 = remove(inbuf);
    if (iVar3 != 0) {
      errexit("error deleting input file",(long)pFVar4);
    }
    pcVar10 = inbuf;
    iVar3 = rename(tmpfile,pcVar10);
    if (iVar3 != 0) {
      errexit("error renaming temporary file",(long)pcVar10);
    }
  }
  os_term(0);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    int       curarg;
    osfildef *fpin;
    osfildef *fpout;
    char      tmpfile[OSFNMAX + 1];
    char      inbuf[OSFNMAX + 1];
    char     *p;
    char     *infile;
    char      buf[128];
    opdef    *oplist = (opdef *)0;
    opctxdef  opctx;
    int       do_create = FALSE;

    /* print main banner */
    rscptf("TADS Resource Manager version 2.2.4\n");
    rscptf("Copyright (c) 1992, 1999 by Michael J. Roberts.  ");
    rscptf("All Rights Reserved.\n");
    if (argc < 2) usage();

    /* set default parsing options */
    opctx.restype = RESTYPE_DFLT;
    opctx.flag = OPFADD | OPFDEL;
    opctx.doing_type = FALSE;

    /* scan file options (these come before the filename) */
    for (curarg = 1 ; curarg < argc ; ++curarg)
    {
        /* check if it's an option - if not, stop looking */
        if (argv[curarg][0] != '-')
            break;
        
        /* check the option */
        if (!stricmp(argv[curarg], "-create"))
        {
            /* note that we want to create the file */
            do_create = TRUE;
        }
        else
        {
            rscptf("unrecognized file option \"%s\"", argv[curarg]);
            errexit("", 1);
        }
    }
    
    /* get the file name */
    infile = argv[curarg++];
    strcpy(inbuf, infile);
    os_defext(inbuf, "gam");

    /* open the file for reading, unless we're creating a new file */
    if (do_create)
    {
        /* creating - we have no input file */
        fpin = 0;
    }
    else if ((fpin = osfoprb(inbuf, OSFTGAME)) == 0)
    {
        /* 
         *   not creating, so the file must already exist - it doesn't, so
         *   issue an error and quit 
         */
        errexit("unable to open resource file", 1);
    }

    /* 
     *   if no operations are desired, and we're not creating a new file,
     *   just list the existing file's contents and quit 
     */
    if (curarg == argc && fpin != 0)
    {
        rscproc(fpin, (osfildef *)0, 0);
        osfcls(fpin);
        os_term(OSEXSUCC);
    }

    /*
     *   Create an output file.  If we're creating a new file, create the
     *   file named on the command line; otherwise, create a temporary
     *   file that we'll write to while working and then rename to the
     *   original input filename after we've finished with the original
     *   input file.  
     */
    if (do_create)
    {
        /* create the new file */
        if ((fpout = osfopwb(inbuf, OSFTGAME)) == 0)
            errexit("unable to create file", 1);

        /* report the creation */
        rscptf("\nFile created.\n");
    }
    else
    {
        /* generate a temporary filename */
        strcpy(tmpfile, inbuf);
        for (p = tmpfile + strlen(tmpfile) ; p > tmpfile &&
                 *(p-1) != ':' && *(p-1) != '\\' && *(p-1) != '/' ; --p);
        strcpy(p, "$TADSRSC.TMP");

        /* open the temporary file */
        if ((fpout = osfopwb(tmpfile, OSFTGAME)) == 0)
            errexit("unable to create temporary file", 1);
    }

    /* see if we need to read a response file */
    if (curarg < argc && argv[curarg][0] == '@')
    {
        osfildef *argfp;
        int       l;
        char     *p;
        
        if (!(argfp = osfoprt(argv[curarg]+1, OSFTTEXT)))
            errexit("unable to open response file", 1);
        
        for (;;)
        {
            if (!osfgets(buf, sizeof(buf), argfp)) break;
            l = strlen(buf);
            if (l && buf[l-1] == '\n') buf[--l] = '\0';
            for (p = buf ; t_isspace(*p) ; ++p);
            if (!*p) continue;
            oplist = addop(oplist, p, &opctx);
        }
        osfcls(argfp);
    }
    else
    {
        for ( ; curarg < argc ; ++curarg)
            oplist = addop(oplist, argv[curarg], &opctx);
    }

    /* process the resources */
    oplist = rscproc(fpin, fpout, oplist);

    /* make sure they all got processed */
    for ( ; oplist != 0 ; oplist = oplist->opnxt)
    {
        if (!(oplist->opflag & OPFDONE))
            rscptf("warning: resource \"%s\" not found\n", oplist->opres);
    }
    
    /* close files */
    if (fpin != 0)
        osfcls(fpin);
    if (fpout != 0)
        osfcls(fpout);
    
    /* 
     *   if we didn't create a new file, remove the original input file
     *   and rename the temp file to the original file name 
     */
    if (!do_create)
    {
        /* remove the original input file */
        if (remove(inbuf))
            errexit("error deleting input file", 1);

        /* rename the temp file to the output file */
        if (rename(tmpfile, inbuf))
            errexit("error renaming temporary file", 1);
    }

    /* success */
    os_term(OSEXSUCC);
    return OSEXSUCC;
}